

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

bool __thiscall cinatra::uri_t::is_websocket(uri_t *this)

{
  size_t sVar1;
  char *__s1;
  int iVar2;
  size_type __rlen;
  bool bVar3;
  
  sVar1 = (this->schema)._M_len;
  __s1 = (this->schema)._M_str;
  if (sVar1 == 3) {
    iVar2 = bcmp(__s1,"wss",3);
    bVar3 = iVar2 == 0;
  }
  else if ((sVar1 == 2) && (iVar2 = bcmp(__s1,"ws",2), iVar2 == 0)) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool is_websocket() { return schema == "ws"sv || schema == "wss"sv; }